

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlNode * __thiscall
despot::util::tinyxml::TiXmlNode::IterateChildren(TiXmlNode *this,char *val,TiXmlNode *previous)

{
  TiXmlNode *previous_local;
  char *val_local;
  TiXmlNode *this_local;
  
  if (previous == (TiXmlNode *)0x0) {
    this_local = FirstChild(this,val);
  }
  else {
    if (previous->parent != this) {
      __assert_fail("previous->parent == this",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                    ,0x14e,
                    "const TiXmlNode *despot::util::tinyxml::TiXmlNode::IterateChildren(const char *, const TiXmlNode *) const"
                   );
    }
    this_local = NextSibling(previous,val);
  }
  return this_local;
}

Assistant:

const TiXmlNode* TiXmlNode::IterateChildren(const char * val,
	const TiXmlNode* previous) const {
	if (!previous) {
		return FirstChild(val);
	} else {
		assert(previous->parent == this);
		return previous->NextSibling(val);
	}
}